

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QtPrivate::QColorShower::setRgb(QColorShower *this,QRgb rgb)

{
  QLineEdit *this_00;
  int *piVar1;
  long in_FS_OFFSET;
  QColor local_60;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->rgbOriginal = true;
  this->curCol = rgb;
  local_50.d.ptr._6_2_ = 0xaaaa;
  local_50.d.d._0_4_ = 0;
  local_50.d.d._4_2_ = 0xffff;
  local_50.d.d._6_2_ = 0;
  local_50.d.ptr._0_4_ = 0;
  local_50.d.ptr._4_2_ = 0;
  QColor::setRgb((uint)&local_50);
  QColor::getHsv((int *)&local_50,&this->hue,&this->sat,&this->val);
  QColSpinBox::setValue(this->hEd,this->hue);
  QColSpinBox::setValue(this->sEd,this->sat);
  QColSpinBox::setValue(this->vEd,this->val);
  QColSpinBox::setValue(this->rEd,(uint)*(byte *)((long)&this->curCol + 2));
  QColSpinBox::setValue(this->gEd,(uint)*(byte *)((long)&this->curCol + 1));
  QColSpinBox::setValue(this->bEd,(uint)(byte)this->curCol);
  this_00 = this->htEd;
  QColor::QColor(&local_60,rgb);
  QColor::name((NameFormat)&local_50);
  QLineEdit::setText(this_00,&local_50);
  piVar1 = (int *)CONCAT26(local_50.d.d._6_2_,CONCAT24(local_50.d.d._4_2_,local_50.d.d._0_4_));
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate
                ((QArrayData *)
                 CONCAT26(local_50.d.d._6_2_,CONCAT24(local_50.d.d._4_2_,local_50.d.d._0_4_)),2,0x10
                );
    }
  }
  showCurrentColor(this);
  updateQColor(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShower::setRgb(QRgb rgb)
{
    rgbOriginal = true;
    curCol = rgb;

    rgb2hsv(currentColor(), hue, sat, val);

    hEd->setValue(hue);
    sEd->setValue(sat);
    vEd->setValue(val);

    rEd->setValue(qRed(currentColor()));
    gEd->setValue(qGreen(currentColor()));
    bEd->setValue(qBlue(currentColor()));

    htEd->setText(QColor(rgb).name());

    showCurrentColor();
    updateQColor();
}